

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5aec29::cmBlockFunctionBlocker::~cmBlockFunctionBlocker
          (cmBlockFunctionBlocker *this)

{
  ~cmBlockFunctionBlocker(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

cmBlockFunctionBlocker::~cmBlockFunctionBlocker()
{
  if (this->Scopes.contains(ScopeType::VARIABLES)) {
    this->Makefile->RaiseScope(this->VariableNames);
  }
}